

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O3

int AF_A_SorcFX2Split(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  PClassActor *pPVar5;
  AActor *pAVar6;
  FState *pFVar7;
  long *plVar8;
  char *__assertion;
  bool bVar9;
  FName local_50;
  FName local_4c;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e0df1;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    plVar8 = (long *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (plVar8 == (long *)0x0) {
LAB_005e0bd5:
        plVar8 = (long *)0x0;
      }
      else {
        pPVar4 = (PClass *)plVar8[1];
        if (pPVar4 == (PClass *)0x0) {
          pPVar4 = (PClass *)(**(code **)*plVar8)(plVar8);
          plVar8[1] = (long)pPVar4;
        }
        bVar9 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar3 && bVar9) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar9 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar3) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e0df1;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005e0c95;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005e0de1;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar4 = (PClass *)puVar2[1];
            if (pPVar4 == (PClass *)0x0) {
              pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar4;
            }
            bVar9 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar3 && bVar9) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar9 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar3) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005e0df1;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005e0de1;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e0c95:
        pPVar5 = (PClassActor *)plVar8[1];
        if (pPVar5 == (PClassActor *)0x0) {
          pPVar5 = (PClassActor *)(**(code **)*plVar8)(plVar8);
          plVar8[1] = (long)pPVar5;
        }
        local_48.X = (double)plVar8[9];
        local_48.Y = (double)plVar8[10];
        local_48.Z = (double)plVar8[0xb];
        pAVar6 = AActor::StaticSpawn(pPVar5,&local_48,NO_REPLACE,false);
        if (pAVar6 != (AActor *)0x0) {
          (pAVar6->target).field_0 =
               *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(plVar8 + 0x3b);
          pAVar6->args[0] = 0;
          pAVar6->specialf1 = (double)plVar8[0x12];
          local_4c.Index = FName::NameManager::FindName(&FName::NameData,"Orbit",false);
          pFVar7 = AActor::FindState(pAVar6,&local_4c);
          AActor::SetState(pAVar6,pFVar7,false);
        }
        pPVar5 = (PClassActor *)plVar8[1];
        if (pPVar5 == (PClassActor *)0x0) {
          pPVar5 = (PClassActor *)(**(code **)*plVar8)(plVar8);
          plVar8[1] = (long)pPVar5;
        }
        local_48.X = (double)plVar8[9];
        local_48.Y = (double)plVar8[10];
        local_48.Z = (double)plVar8[0xb];
        pAVar6 = AActor::StaticSpawn(pPVar5,&local_48,NO_REPLACE,false);
        if (pAVar6 != (AActor *)0x0) {
          (pAVar6->target).field_0 =
               *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(plVar8 + 0x3b);
          pAVar6->args[0] = 1;
          pAVar6->specialf1 = (double)plVar8[0x12];
          local_50.Index = FName::NameManager::FindName(&FName::NameData,"Orbit",false);
          pFVar7 = AActor::FindState(pAVar6,&local_50);
          AActor::SetState(pAVar6,pFVar7,false);
        }
        (**(code **)(*plVar8 + 0x20))(plVar8);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e0df1;
    }
    if (plVar8 == (long *)0x0) goto LAB_005e0bd5;
  }
LAB_005e0de1:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005e0df1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0x2ed,"int AF_A_SorcFX2Split(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcFX2Split)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;

	mo = Spawn(self->GetClass(), self->Pos(), NO_REPLACE);
	if (mo)
	{
		mo->target = self->target;
		mo->args[0] = 0;									// CW
		mo->specialf1 = self->Angles.Yaw.Degrees;			// Set angle
		mo->SetState (mo->FindState("Orbit"));
	}
	mo = Spawn(self->GetClass(), self->Pos(), NO_REPLACE);
	if (mo)
	{
		mo->target = self->target;
		mo->args[0] = 1;									// CCW
		mo->specialf1 = self->Angles.Yaw.Degrees;			// Set angle
		mo->SetState (mo->FindState("Orbit"));
	}
	self->Destroy ();
	return 0;
}